

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.h
# Opt level: O3

void __thiscall sptk::ScalarOperation::~ScalarOperation(ScalarOperation *this)

{
  pointer ppMVar1;
  pointer ppMVar2;
  
  this->_vptr_ScalarOperation = (_func_int **)&PTR__ScalarOperation_00116420;
  ppMVar2 = (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar2 != ppMVar1) {
    do {
      if (*ppMVar2 != (ModuleInterface *)0x0) {
        (*(*ppMVar2)->_vptr_ModuleInterface[1])();
        ppMVar1 = (this->modules_).
                  super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppMVar2 = ppMVar2 + 1;
    } while (ppMVar2 != ppMVar1);
    ppMVar2 = (this->modules_).
              super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppMVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppMVar2);
  return;
}

Assistant:

virtual ~ScalarOperation() {
    for (std::vector<ScalarOperation::ModuleInterface*>::iterator itr(
             modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }